

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

int __thiscall
kj::HttpHeaders::clone(HttpHeaders *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Vector<kj::HttpHeaders::Header> *this_00;
  HttpHeaderTable *pHVar1;
  Header *pHVar2;
  Header *pHVar3;
  StringPtr *pSVar4;
  ulong uVar5;
  ulong newSize;
  long lVar6;
  ulong size;
  long lVar7;
  StringPtr SVar8;
  StringPtr str;
  StringPtr str_00;
  
  pHVar1 = *(HttpHeaderTable **)__fn;
  this->table = pHVar1;
  uVar5 = (ulong)((long)(pHVar1->namesById).builder.pos - (long)(pHVar1->namesById).builder.ptr) >>
          4 & 0xffffffff;
  pSVar4 = (StringPtr *)
           _::HeapArrayDisposer::allocateImpl
                     (0x10,uVar5,uVar5,
                      _::HeapArrayDisposer::Allocate_<kj::StringPtr,_false,_false>::construct,
                      _::HeapArrayDisposer::Allocate_<kj::StringPtr,_false,_false>::destruct);
  (this->indexedHeaders).ptr = pSVar4;
  (this->indexedHeaders).size_ = uVar5;
  (this->indexedHeaders).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  (this->unindexedHeaders).builder.ptr = (Header *)0x0;
  (this->unindexedHeaders).builder.pos = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
  (this->unindexedHeaders).builder.endPtr = (Header *)0x0;
  (this->ownedStrings).builder.ptr = (Array<char> *)0x0;
  (this->ownedStrings).builder.pos = (RemoveConst<kj::Array<char>_> *)0x0;
  (this->ownedStrings).builder.endPtr = (Array<char> *)0x0;
  lVar7 = *(long *)(__fn + 0x10);
  if (lVar7 != 0) {
    lVar6 = 8;
    do {
      uVar5 = *(ulong *)(*(long *)(__fn + 8) + lVar6);
      if (1 < uVar5) {
        SVar8.content.size_ = uVar5;
        SVar8.content.ptr = *(char **)(*(long *)(__fn + 8) + -8 + lVar6);
        SVar8 = cloneToOwn(this,SVar8);
        pSVar4 = (this->indexedHeaders).ptr;
        *(char **)((long)pSVar4 + lVar6 + -8) = SVar8.content.ptr;
        *(size_t *)((long)&(pSVar4->content).ptr + lVar6) = SVar8.content.size_;
      }
      lVar6 = lVar6 + 0x10;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  this_00 = &this->unindexedHeaders;
  size = *(long *)(__fn + 0x28) - *(long *)(__fn + 0x20) >> 5;
  pHVar2 = (this->unindexedHeaders).builder.ptr;
  pHVar3 = (this->unindexedHeaders).builder.endPtr;
  uVar5 = (long)pHVar3 - (long)pHVar2;
  if (uVar5 < (ulong)(*(long *)(__fn + 0x28) - *(long *)(__fn + 0x20))) {
    newSize = 4;
    if (pHVar3 != pHVar2) {
      newSize = (long)uVar5 >> 4;
    }
    if (newSize < size) {
      newSize = size;
    }
    Vector<kj::HttpHeaders::Header>::setCapacity(this_00,newSize);
  }
  ArrayBuilder<kj::HttpHeaders::Header>::resize(&this_00->builder,size);
  if (*(long *)(__fn + 0x28) - *(long *)(__fn + 0x20) != 0) {
    lVar7 = *(long *)(__fn + 0x28) - *(long *)(__fn + 0x20) >> 5;
    lVar6 = 0;
    do {
      str.content.size_ = *(size_t *)(*(long *)(__fn + 0x20) + 8 + lVar6);
      str.content.ptr = *(char **)(*(long *)(__fn + 0x20) + lVar6);
      SVar8 = cloneToOwn(this,str);
      pHVar2 = (this->unindexedHeaders).builder.ptr;
      *(char **)((long)&(pHVar2->name).content.ptr + lVar6) = SVar8.content.ptr;
      *(size_t *)((long)&(pHVar2->name).content.size_ + lVar6) = SVar8.content.size_;
      str_00.content.size_ = *(size_t *)(*(long *)(__fn + 0x20) + 0x18 + lVar6);
      str_00.content.ptr = *(char **)(*(long *)(__fn + 0x20) + 0x10 + lVar6);
      SVar8 = cloneToOwn(this,str_00);
      pHVar2 = (this_00->builder).ptr;
      *(char **)((long)&(pHVar2->value).content.ptr + lVar6) = SVar8.content.ptr;
      *(size_t *)((long)&(pHVar2->value).content.size_ + lVar6) = SVar8.content.size_;
      lVar6 = lVar6 + 0x20;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  return (int)this;
}

Assistant:

HttpHeaders HttpHeaders::clone() const {
  HttpHeaders result(*table);

  for (auto i: kj::indices(indexedHeaders)) {
    if (indexedHeaders[i] != nullptr) {
      result.indexedHeaders[i] = result.cloneToOwn(indexedHeaders[i]);
    }
  }

  result.unindexedHeaders.resize(unindexedHeaders.size());
  for (auto i: kj::indices(unindexedHeaders)) {
    result.unindexedHeaders[i].name = result.cloneToOwn(unindexedHeaders[i].name);
    result.unindexedHeaders[i].value = result.cloneToOwn(unindexedHeaders[i].value);
  }

  return result;
}